

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_enumerate(char *args)

{
  size_t sVar1;
  long *plVar2;
  undefined8 uVar3;
  long *local_28;
  char **i;
  int file_count;
  char **rc;
  char *args_local;
  
  rc = (char **)args;
  if (*args == '\"') {
    rc = (char **)(args + 1);
    sVar1 = strlen((char *)rc);
    *(char *)((long)rc + (sVar1 - 1)) = '\0';
  }
  plVar2 = (long *)PHYSFS_enumerateFiles(rc);
  if (plVar2 == (long *)0x0) {
    uVar3 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar3);
  }
  else {
    i._4_4_ = 0;
    for (local_28 = plVar2; *local_28 != 0; local_28 = local_28 + 1) {
      printf("%s\n",*local_28);
      i._4_4_ = i._4_4_ + 1;
    }
    printf("\n total (%d) files.\n",(ulong)i._4_4_);
    PHYSFS_freeList(plVar2);
  }
  return 1;
}

Assistant:

static int cmd_enumerate(char *args)
{
    char **rc;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    rc = PHYSFS_enumerateFiles(args);

    if (rc == NULL)
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());
    else
    {
        int file_count;
        char **i;
        for (i = rc, file_count = 0; *i != NULL; i++, file_count++)
            printf("%s\n", *i);

        printf("\n total (%d) files.\n", file_count);
        PHYSFS_freeList(rc);
    } /* else */

    return 1;
}